

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O2

void myarima_summary(myarima_object obj)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  sarimax_object psVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  double dVar13;
  
  psVar7 = obj->sarimax;
  iVar9 = psVar7->q;
  iVar11 = psVar7->p;
  iVar2 = psVar7->P;
  iVar3 = psVar7->Q;
  iVar4 = psVar7->M;
  iVar5 = psVar7->r;
  if ((uint)psVar7->method < 2) {
    puts("\n\nExit Status ");
    printf("Return Code : %d \n",(ulong)(uint)obj->sarimax->retval);
    printf("Exit Message : ");
    uVar6 = obj->sarimax->retval;
    if (((ulong)uVar6 < 0x10) && ((0x9493U >> (uVar6 & 0x1f) & 1) != 0)) {
      printf((&PTR_anon_var_dwarf_7e0_00158d10)[uVar6]);
    }
  }
  puts("\n");
  psVar7 = obj->sarimax;
  iVar10 = 0;
  printf("ARIMA Seasonal Order : ( %d, %d, %d) * (%d, %d, %d) \n",(ulong)(uint)psVar7->p,
         (ulong)(uint)psVar7->d,(ulong)(uint)psVar7->q,(ulong)(uint)psVar7->P,(ulong)(uint)psVar7->D
         ,psVar7->Q);
  putchar(10);
  printf("%-20s%-20s%-20s \n\n","Coefficients","Value","Standard Error");
  iVar9 = iVar9 + iVar11 + iVar2 + iVar3 + iVar4 + 1;
  for (lVar12 = 0; psVar7 = obj->sarimax, lVar12 < psVar7->p; lVar12 = lVar12 + 1) {
    dVar1 = psVar7->phi[lVar12];
    if (psVar7->vcov[iVar10] < 0.0) {
      sqrt(psVar7->vcov[iVar10]);
    }
    printf("AR%-15d%-20g%-20g \n",dVar1,(ulong)((int)lVar12 + 1));
    iVar10 = iVar10 + iVar9;
  }
  for (lVar12 = 0; lVar12 < psVar7->q; lVar12 = lVar12 + 1) {
    dVar1 = psVar7->theta[lVar12];
    if (psVar7->vcov[(psVar7->p + (int)lVar12) * iVar9] < 0.0) {
      sqrt(psVar7->vcov[(psVar7->p + (int)lVar12) * iVar9]);
    }
    printf("MA%-15d%-20g%-20g \n",dVar1,(ulong)((int)lVar12 + 1));
    psVar7 = obj->sarimax;
  }
  for (lVar12 = 0; lVar12 < psVar7->P; lVar12 = lVar12 + 1) {
    dVar1 = psVar7->PHI[lVar12];
    if (psVar7->vcov[(psVar7->p + psVar7->q + (int)lVar12) * iVar9] < 0.0) {
      sqrt(psVar7->vcov[(psVar7->p + psVar7->q + (int)lVar12) * iVar9]);
    }
    printf("SAR%-14d%-20g%-20g \n",dVar1,(ulong)((int)lVar12 + 1));
    psVar7 = obj->sarimax;
  }
  for (lVar12 = 0; lVar12 < psVar7->Q; lVar12 = lVar12 + 1) {
    dVar1 = psVar7->THETA[lVar12];
    if (psVar7->vcov[(psVar7->p + psVar7->q + psVar7->P + (int)lVar12) * iVar9] < 0.0) {
      sqrt(psVar7->vcov[(psVar7->p + psVar7->q + psVar7->P + (int)lVar12) * iVar9]);
    }
    printf("SMA%-14d%-20g%-20g \n",dVar1,(ulong)((int)lVar12 + 1));
    psVar7 = obj->sarimax;
  }
  putchar(10);
  psVar7 = obj->sarimax;
  iVar11 = psVar7->q + psVar7->p + psVar7->P + psVar7->Q;
  dVar1 = psVar7->mean;
  if (iVar5 < iVar4) {
    if (psVar7->vcov[iVar11 * iVar9] < 0.0) {
      sqrt(psVar7->vcov[iVar11 * iVar9]);
    }
    printf("%-17s%-20g%-20g \n",dVar1,"MEAN");
    iVar11 = iVar11 + 1;
  }
  else {
    printf("%-17s%-20g \n",dVar1,"MEAN");
  }
  if (obj->idrift == 1) {
    dVar1 = *obj->sarimax->exog;
    dVar13 = obj->sarimax->vcov[iVar11 * iVar9];
    if (dVar13 < 0.0) {
      dVar13 = sqrt(dVar13);
    }
    else {
      dVar13 = SQRT(dVar13);
    }
    printf("%-17s%-20g%-20g \n",dVar1,dVar13,"TREND");
    iVar11 = iVar11 + 1;
    lVar12 = 1;
  }
  else {
    printf("%-17s%-20g \n",0,"TREND");
    lVar12 = 0;
  }
  iVar11 = iVar11 * iVar9;
  for (; psVar7 = obj->sarimax, lVar12 < psVar7->r; lVar12 = lVar12 + 1) {
    dVar1 = psVar7->exog[lVar12];
    dVar13 = psVar7->vcov[iVar11];
    if (dVar13 < 0.0) {
      dVar13 = sqrt(dVar13);
    }
    else {
      dVar13 = SQRT(dVar13);
    }
    printf("%-17s%-20g%-20g \n",dVar1,dVar13,"EXOG");
    iVar11 = iVar11 + iVar9;
  }
  putchar(10);
  printf("%-17s%-20g \n",obj->sigma2,"SIGMA^2");
  putchar(10);
  printf("ESTIMATION METHOD : ");
  uVar8 = (ulong)(uint)obj->sarimax->method;
  if (uVar8 < 3) {
    printf(*(char **)(&DAT_00158d90 + uVar8 * 8));
  }
  puts("\n");
  printf("OPTIMIZATION METHOD : ");
  uVar8 = (ulong)(uint)obj->sarimax->optmethod;
  if (uVar8 < 8) {
    printf((&PTR_anon_var_dwarf_959_00158da8)[uVar8]);
  }
  puts("\n");
  printf("AIC criterion : %g ",obj->aic);
  puts("\n");
  printf("BIC criterion : %g ",obj->bic);
  puts("\n");
  printf("AICC criterion : %g ",obj->aicc);
  puts("\n");
  if (2 < (uint)obj->sarimax->method) {
    return;
  }
  printf("Log Likelihood : %g ",obj->sarimax->loglik);
  puts("\n");
  return;
}

Assistant:

void myarima_summary(myarima_object obj) {
	int i, pq,t,nd,ncxreg,mean;
	pq = obj->sarimax->p + obj->sarimax->q + obj->sarimax->P + obj->sarimax->Q + obj->sarimax->M;
	mean = obj->sarimax->M - obj->sarimax->r;
	
	if (obj->sarimax->method == 0 || obj->sarimax->method == 1) {
		printf("\n\nExit Status \n");
		printf("Return Code : %d \n", obj->sarimax->retval);
		printf("Exit Message : ");

		if (obj->sarimax->retval == 0) {
			printf("Input Error");
		}
		else if (obj->sarimax->retval == 1) {
			printf("Probable Success");
		}
		else if (obj->sarimax->retval == 4) {
			printf("Optimization Routine didn't converge");
		}
		else if (obj->sarimax->retval == 7) {
			printf("Exogenous Variables are collinear");
		}
		else if (obj->sarimax->retval == 10) {
			printf("Nonstationary AR part");
		}
		else if (obj->sarimax->retval == 12) {
			printf("Nonstationary Seasonal AR part");
		}
		else if (obj->sarimax->retval == 15) {
			printf("Optimization Routine Encountered Inf/Nan Values");
		}
	}
	printf("\n\n");
	printf("ARIMA Seasonal Order : ( %d, %d, %d) * (%d, %d, %d) \n",obj->sarimax->p,obj->sarimax->d,obj->sarimax->q,
	 obj->sarimax->P,obj->sarimax->D,obj->sarimax->Q );
	printf("\n");
	//mdisplay(obj->vcov,pq,pq);
	printf("%-20s%-20s%-20s \n\n", "Coefficients", "Value", "Standard Error");
	for (i = 0; i < obj->sarimax->p; ++i) {
		printf("AR%-15d%-20g%-20g \n", i + 1, obj->sarimax->phi[i], sqrt(obj->sarimax->vcov[i + pq*i]));
	}
	for (i = 0; i < obj->sarimax->q; ++i) {
		t = obj->sarimax->p + i;
		printf("MA%-15d%-20g%-20g \n", i + 1, obj->sarimax->theta[i], sqrt(obj->sarimax->vcov[t + pq * t]));
	}
	for (i = 0; i < obj->sarimax->P; ++i) {
		t = obj->sarimax->p + obj->sarimax->q + i;
		printf("SAR%-14d%-20g%-20g \n", i + 1, obj->sarimax->PHI[i], sqrt(obj->sarimax->vcov[t + pq * t]));
	}
	for (i = 0; i < obj->sarimax->Q; ++i) {
		t = obj->sarimax->p + obj->sarimax->q + obj->sarimax->P + i;
		printf("SMA%-14d%-20g%-20g \n", i + 1, obj->sarimax->THETA[i], sqrt(obj->sarimax->vcov[t + pq * t]));
	}
	printf("\n");
	t = obj->sarimax->p + obj->sarimax->q + obj->sarimax->P + obj->sarimax->Q;
	if (mean > 0) {
		printf("%-17s%-20g%-20g \n", "MEAN", obj->sarimax->mean, sqrt(obj->sarimax->vcov[t + pq * t]));
		t++;
		
	}
	else {
		printf("%-17s%-20g \n", "MEAN", obj->sarimax->mean);
	}
	ncxreg = 0;
	if (obj->idrift == 1) {
		printf("%-17s%-20g%-20g \n", "TREND", obj->sarimax->exog[0], sqrt(obj->sarimax->vcov[t + pq * t]));
		t++;
		ncxreg++;
	} else {
		printf("%-17s%-20g \n", "TREND", 0.0);
	}
	for(i = ncxreg; i < obj->sarimax->r; ++i) {
		printf("%-17s%-20g%-20g \n", "EXOG", obj->sarimax->exog[i], sqrt(obj->sarimax->vcov[t + pq * t]));
		t++;
	}
	printf("\n");
	printf("%-17s%-20g \n", "SIGMA^2", obj->sigma2);
	printf("\n");
	printf("ESTIMATION METHOD : ");
	if (obj->sarimax->method == 0) {
		printf("CSS-MLE");
	}
	else if (obj->sarimax->method == 1) {
		printf("MLE");
	}
	else if (obj->sarimax->method == 2) {
		printf("CSS");
	}
	printf("\n\n");
	printf("OPTIMIZATION METHOD : ");
	
	if (obj->sarimax->optmethod == 0) {
		printf("Nelder-Mead");
	}
	else if (obj->sarimax->optmethod == 1) {
		printf("Newton Line Search");
	}
	else if (obj->sarimax->optmethod == 2) {
		printf("Newton Trust Region - Hook Step");
	}
	else if (obj->sarimax->optmethod == 3) {
		printf("Newton Trust Region - Double Dog-Leg");
	}
	else if (obj->sarimax->optmethod == 4) {
		printf("Conjugate Gradient");
	}
	else if (obj->sarimax->optmethod == 5) {
		printf("BFGS");
	}
	else if (obj->sarimax->optmethod == 6) {
		printf("L-BFGS");
	}
	else if (obj->sarimax->optmethod == 7) {
		printf("BFGS More-Thuente Line Search");
	}
	
	printf("\n\n");
	
	printf("AIC criterion : %g ", obj->aic);
	printf("\n\n");
	printf("BIC criterion : %g ", obj->bic);
	printf("\n\n");
	printf("AICC criterion : %g ", obj->aicc);
	printf("\n\n");
	if (obj->sarimax->method == 0 || obj->sarimax->method == 1 || obj->sarimax->method == 2) {
		printf("Log Likelihood : %g ", obj->sarimax->loglik);
		printf("\n\n");
	}
}